

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackTest.cpp
# Opt level: O2

void print<ft::stack<double,ft::deque<double,ft::allocator<double>>>>
               (stack<double,_ft::deque<double,_ft::allocator<double>_>_> *t,char *s)

{
  ostream *poVar1;
  reference pdVar2;
  
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 3;
  poVar1 = std::operator<<((ostream *)&std::cout,s);
  std::operator<<(poVar1," contains:");
  while ((t->c).m_size != 0) {
    std::operator<<((ostream *)&std::cout,' ');
    pdVar2 = ft::deque<double,_ft::allocator<double>_>::back(&t->c);
    std::ostream::_M_insert<double>(*pdVar2);
    ft::deque<double,_ft::allocator<double>_>::pop_back(&t->c);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void	print(T & t, char const * s) {
	std::cout << std::setw(3) << s << " contains:";
	while (!t.empty()) {
		std::cout << ' ' << t.top();
		t.pop();
	}
	std::cout << std::endl;
}